

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::EnumDescriptorProto::ByteSizeLong(EnumDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SymbolVisibility value;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  reference value_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_01;
  reference value_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  size_t sVar5;
  const_reference value_02;
  uint32_t *puVar6;
  string *value_03;
  int local_a4;
  int n;
  int i;
  EnumDescriptorProto_EnumReservedRange *msg_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *__range3_1;
  EnumValueDescriptorProto *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  EnumDescriptorProto *this_;
  EnumDescriptorProto *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_value_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_value(this);
  __end3 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::begin(this_00);
  msg = (EnumValueDescriptorProto *)
        RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value_00 = internal::RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::
               operator*(&__end3);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::EnumValueDescriptorProto>
                      (value_00);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::operator++
              (&__end3);
  }
  iVar3 = _internal_reserved_range_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_01 = _internal_reserved_range(this);
  __end3_1 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::begin
                       (this_01);
  msg_1 = (EnumDescriptorProto_EnumReservedRange *)
          RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::end(this_01);
  while (bVar2 = internal::operator!=(&__end3_1,(iterator *)&msg_1), bVar2) {
    value_01 = internal::
               RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto_EnumReservedRange>::
               operator*(&__end3_1);
    sVar5 = internal::WireFormatLite::
            MessageSize<google::protobuf::EnumDescriptorProto_EnumReservedRange>(value_01);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto_EnumReservedRange>::
    operator++(&__end3_1);
  }
  pRVar4 = _internal_reserved_name_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  sVar5 = internal::FromIntSize(iVar3);
  sStack_58 = sVar5 + sStack_58;
  local_a4 = 0;
  pRVar4 = _internal_reserved_name_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; local_a4 < iVar3; local_a4 = local_a4 + 1) {
    pRVar4 = _internal_reserved_name_abi_cxx11_(this);
    value_02 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(pRVar4,local_a4);
    sVar5 = internal::WireFormatLite::StringSize(value_02);
    sStack_58 = sVar5 + sStack_58;
  }
  puVar6 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar6;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      value_03 = _internal_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(value_03);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::EnumOptions>
                        ((this->field_0)._impl_.options_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      value = _internal_visibility(this);
      sVar5 = internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t EnumDescriptorProto::ByteSizeLong() const {
  const EnumDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
    {
      total_size += 1UL * this_._internal_value_size();
      for (const auto& msg : this_._internal_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
    {
      total_size += 1UL * this_._internal_reserved_range_size();
      for (const auto& msg : this_._internal_reserved_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string reserved_name = 5;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_reserved_name().size());
      for (int i = 0, n = this_._internal_reserved_name().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_reserved_name().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.EnumOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SymbolVisibility visibility = 6;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}